

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::LocationRecorder
          (LocationRecorder *this,Parser *parser)

{
  SourceCodeInfo_Location *pSVar1;
  Token *pTVar2;
  Parser *parser_local;
  LocationRecorder *this_local;
  
  this->parser_ = parser;
  pSVar1 = SourceCodeInfo::add_location(this->parser_->source_code_info_);
  this->location_ = pSVar1;
  pSVar1 = this->location_;
  pTVar2 = io::Tokenizer::current(this->parser_->input_);
  SourceCodeInfo_Location::add_span(pSVar1,pTVar2->line);
  pSVar1 = this->location_;
  pTVar2 = io::Tokenizer::current(this->parser_->input_);
  SourceCodeInfo_Location::add_span(pSVar1,pTVar2->column);
  return;
}

Assistant:

Parser::LocationRecorder::LocationRecorder(Parser* parser)
  : parser_(parser),
    location_(parser_->source_code_info_->add_location()) {
  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}